

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_math_min_max(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  undefined1 auVar1 [16];
  JSValue *pJVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  JSValue *pJVar8;
  long lVar9;
  int64_t *piVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar14;
  JSFloat64Union a1;
  double dVar15;
  JSValue JVar16;
  JSValue val;
  JSValue val_00;
  double r;
  double a;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  if (argc == 0) {
    uVar6 = 0xfff0000000000000;
    if (magic == 0) {
      uVar6 = 0x7ff0000000000000;
    }
    uVar14 = 7;
    uVar7 = uVar6;
  }
  else {
    if ((int)argv->tag == 0) {
      uVar5 = (argv->u).int32;
      bVar11 = 1 < argc;
      uVar4 = 1;
      if (argc < 2) {
LAB_0016c58b:
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        if ((int)argv[1].tag == 0) {
          uVar14 = (ulong)(uint)argc;
          pJVar8 = argv + 1;
          uVar6 = 1;
          do {
            uVar4 = (pJVar8->u).int32;
            if (magic == 0) {
              if ((int)uVar4 <= (int)uVar5) {
                uVar5 = uVar4;
              }
            }
            else if ((int)uVar5 <= (int)uVar4) {
              uVar5 = uVar4;
            }
            lVar9 = (2 - uVar14) + uVar6;
            uVar6 = uVar6 + 1;
            if (lVar9 == 1) {
              bVar11 = uVar6 < uVar14;
              uVar4 = argc;
              goto LAB_0016c58b;
            }
            pJVar2 = pJVar8 + 1;
            pJVar8 = pJVar8 + 1;
          } while ((int)pJVar2->tag == 0);
          bVar11 = uVar6 < uVar14;
        }
        uVar4 = (uint)uVar6;
        local_58 = (double)(int)uVar5;
        uVar6 = 0;
      }
      if (!bVar11) {
        uVar14 = 0;
        uVar7 = 0;
        goto LAB_0016c6d2;
      }
    }
    else {
      val.tag = argv->tag;
      val.u.ptr = (argv->u).ptr;
      iVar3 = JS_ToFloat64(ctx,&local_58,val);
      if (iVar3 != 0) {
LAB_0016c6c9:
        uVar6 = 0;
        uVar14 = 6;
        uVar7 = 0;
        goto LAB_0016c6d2;
      }
      uVar4 = 1;
    }
    local_48._8_8_ = 0;
    local_48._0_8_ = (ulong)local_58;
    dVar15 = local_58;
    if ((int)uVar4 < argc) {
      lVar9 = (ulong)(uint)argc - (ulong)uVar4;
      piVar10 = &argv[uVar4].tag;
      do {
        val_00.tag = *piVar10;
        val_00.u.ptr = ((JSValueUnion *)(piVar10 + -1))->ptr;
        iVar3 = JS_ToFloat64(ctx,&local_50,val_00);
        if (iVar3 != 0) goto LAB_0016c6c9;
        dVar15 = local_48._0_8_;
        if (!NAN(dVar15)) {
          uVar13 = (undefined4)((ulong)local_50 >> 0x20);
          if (NAN(local_50)) {
            local_48._8_8_ = 0;
            local_48._0_8_ = (ulong)local_50;
          }
          else {
            uVar12 = SUB84(local_50,0);
            if (magic == 0) {
              if (dVar15 != 0.0 || local_50 != 0.0) {
                uVar6 = -(ulong)NAN(dVar15);
                uVar14 = uVar6 & (ulong)local_50;
                if (dVar15 <= local_50) {
                  uVar12 = local_48._0_4_;
                  uVar13 = local_48._4_4_;
                }
                goto LAB_0016c656;
              }
              auVar1._8_8_ = 0;
              auVar1._0_8_ = local_50;
              local_48 = local_48 | auVar1;
            }
            else if (dVar15 != 0.0 || local_50 != 0.0) {
              uVar6 = -(ulong)NAN(dVar15);
              uVar14 = uVar6 & (ulong)local_50;
              if (local_50 <= dVar15) {
                uVar12 = local_48._0_4_;
                uVar13 = local_48._4_4_;
              }
LAB_0016c656:
              local_48._8_8_ = 0;
              local_48._0_8_ = ~uVar6 & CONCAT44(uVar13,uVar12) | uVar14;
            }
            else {
              local_48._0_8_ = (ulong)dVar15 & (ulong)local_50;
              local_48._8_8_ = 0;
            }
          }
        }
        dVar15 = local_48._0_8_;
        piVar10 = piVar10 + 2;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    uVar6 = (ulong)dVar15 & 0xffffffff;
    uVar7 = (ulong)dVar15 & 0xffffffff00000000;
    if (dVar15 == (double)(int)dVar15) {
      uVar6 = (ulong)(uint)(int)dVar15;
      uVar7 = 0;
    }
    uVar14 = 7;
    if (dVar15 == (double)(int)dVar15) {
      uVar14 = 0;
    }
  }
LAB_0016c6d2:
  JVar16.u.ptr = (void *)(uVar6 & 0xffffffff | uVar7);
  JVar16.tag = uVar14;
  return JVar16;
}

Assistant:

static JSValue js_math_min_max(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int magic)
{
    BOOL is_max = magic;
    double r, a;
    int i;
    uint32_t tag;

    if (unlikely(argc == 0)) {
        return __JS_NewFloat64(ctx, is_max ? -1.0 / 0.0 : 1.0 / 0.0);
    }

    tag = JS_VALUE_GET_TAG(argv[0]);
    if (tag == JS_TAG_INT) {
        int a1, r1 = JS_VALUE_GET_INT(argv[0]);
        for(i = 1; i < argc; i++) {
            tag = JS_VALUE_GET_TAG(argv[i]);
            if (tag != JS_TAG_INT) {
                r = r1;
                goto generic_case;
            }
            a1 = JS_VALUE_GET_INT(argv[i]);
            if (is_max)
                r1 = max_int(r1, a1);
            else
                r1 = min_int(r1, a1);

        }
        return JS_NewInt32(ctx, r1);
    } else {
        if (JS_ToFloat64(ctx, &r, argv[0]))
            return JS_EXCEPTION;
        i = 1;
    generic_case:
        while (i < argc) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isnan(r)) {
                if (isnan(a)) {
                    r = a;
                } else {
                    if (is_max)
                        r = js_fmax(r, a);
                    else
                        r = js_fmin(r, a);
                }
            }
            i++;
        }
        return JS_NewFloat64(ctx, r);
    }
}